

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlyphBoundaries.h
# Opt level: O1

void __thiscall
GlyphBoundaries::AddExitMinMax(GlyphBoundaries *this,int icellX,int icellY,int gbcSide,int mVal)

{
  int iVar1;
  int (*paiVar2) [2];
  
  iVar1 = icellX + icellY * 4;
  paiVar2 = this->m_rggbcellSub[iVar1].m_mExit + gbcSide;
  if (mVal < (*paiVar2)[0]) {
    (*paiVar2)[0] = mVal;
  }
  if (this->m_rggbcellSub[iVar1].m_mExit[gbcSide][1] < mVal) {
    this->m_rggbcellSub[iVar1].m_mExit[gbcSide][1] = mVal;
  }
  return;
}

Assistant:

int CellIndex(int x, int y) { return (y * gbgridCellsH) + x; }